

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

MSize lj_tab_len_hint(GCtab *t,size_t hint)

{
  MSize MVar1;
  long *plVar2;
  bool bVar3;
  cTValue *tv;
  size_t asize;
  size_t hint_local;
  GCtab *t_local;
  
  plVar2 = (long *)((t->array).ptr64 + hint * 8);
  if (hint + 1 < (ulong)t->asize) {
    bVar3 = false;
    if (*plVar2 != -1) {
      bVar3 = plVar2[1] == -1;
    }
    if (bVar3) {
      return (MSize)hint;
    }
  }
  else if (((hint + 1 <= (ulong)t->asize) && (t->hmask == 0)) && (*plVar2 != -1)) {
    return (MSize)hint;
  }
  MVar1 = lj_tab_len(t);
  return MVar1;
}

Assistant:

MSize LJ_FASTCALL lj_tab_len_hint(GCtab *t, size_t hint)
{
  size_t asize = (size_t)t->asize;
  cTValue *tv = arrayslot(t, hint);
  if (LJ_LIKELY(hint+1 < asize)) {
    if (LJ_LIKELY(!tvisnil(tv) && tvisnil(tv+1))) return (MSize)hint;
  } else if (hint+1 <= asize && LJ_LIKELY(t->hmask == 0) && !tvisnil(tv)) {
    return (MSize)hint;
  }
  return lj_tab_len(t);
}